

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

void P_AutoUseStrifeHealth(player_t *player)

{
  AInventory *pAVar1;
  AInventory *pAVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  TArray<AInventory_*,_AInventory_*> Items;
  TArray<AInventory_*,_AInventory_*> local_38;
  
  local_38.Array = (AInventory **)0x0;
  local_38.Most = 0;
  local_38.Count = 0;
  pAVar1 = (player->mo->super_AActor).Inventory.field_0.p;
  pPVar3 = AHealthPickup::RegistrationInfo.MyClass;
  if ((pAVar1 != (AInventory *)0x0) &&
     (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (player->mo->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
    pAVar1 = (AInventory *)0x0;
    pPVar3 = AHealthPickup::RegistrationInfo.MyClass;
  }
  while (pAVar2 = pAVar1, AHealthPickup::RegistrationInfo.MyClass = pPVar3,
        pAVar2 != (AInventory *)0x0) {
    if (0 < pAVar2->Amount) {
      if ((pAVar2->super_AActor).super_DThinker.super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(pAVar2->super_AActor).super_DThinker.super_DObject._vptr_DObject)(pAVar2);
        (pAVar2->super_AActor).super_DThinker.super_DObject.Class =
             (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar5 = (pAVar2->super_AActor).super_DThinker.super_DObject.Class;
      bVar9 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar3 && bVar9) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar9 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar3) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if ((bVar9) && (*(int *)&pAVar2->field_0x4fc == 3)) {
        TArray<AInventory_*,_AInventory_*>::Grow(&local_38,1);
        local_38.Array[local_38.Count] = pAVar2;
        local_38.Count = local_38.Count + 1;
      }
    }
    pAVar1 = (pAVar2->super_AActor).Inventory.field_0.p;
    pPVar3 = AHealthPickup::RegistrationInfo.MyClass;
    if ((pAVar1 != (AInventory *)0x0) &&
       (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
      (pAVar2->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
      pAVar1 = (AInventory *)0x0;
      pPVar3 = AHealthPickup::RegistrationInfo.MyClass;
    }
  }
  if (sv_disableautohealth.Value == false) {
    while (local_38.Count != 0) {
      uVar6 = 0;
      uVar8 = 0xffffffff;
      iVar4 = 0;
      do {
        if (iVar4 < (local_38.Array[uVar6]->super_AActor).health) {
          iVar4 = local_38.Array[uVar6]->Amount;
          uVar8 = uVar6 & 0xffffffff;
        }
        uVar6 = uVar6 + 1;
      } while (local_38.Count + (local_38.Count == 0) != uVar6);
      uVar7 = (uint)uVar8;
      do {
        if (0x31 < player->health) break;
        iVar4 = (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x17])();
      } while ((char)iVar4 != '\0');
      if (0x31 < player->health) break;
      if (uVar7 < local_38.Count) {
        local_38.Count = local_38.Count - 1;
        if (uVar7 <= local_38.Count && local_38.Count - uVar7 != 0) {
          memmove(local_38.Array + uVar8,local_38.Array + (uVar7 + 1),
                  (ulong)(local_38.Count - uVar7) << 3);
        }
      }
    }
  }
  TArray<AInventory_*,_AInventory_*>::~TArray(&local_38);
  return;
}

Assistant:

void P_AutoUseStrifeHealth (player_t *player)
{
	TArray<AInventory *> Items;

	for(AInventory *inv = player->mo->Inventory; inv != NULL; inv = inv->Inventory)
	{
		if (inv->Amount > 0 && inv->IsKindOf(RUNTIME_CLASS(AHealthPickup)))
		{
			int mode = static_cast<AHealthPickup*>(inv)->autousemode;

			if (mode == 3) Items.Push(inv);
		}
	}

	if (!sv_disableautohealth)
	{
		while (Items.Size() > 0)
		{
			int maxhealth = 0;
			int index = -1;

			// Find the largest item in the list
			for(unsigned i = 0; i < Items.Size(); i++)
			{
				if (Items[i]->health > maxhealth)
				{
					index = i;
					maxhealth = Items[i]->Amount;
				}
			}

			while (player->health < 50)
			{
				if (!player->mo->UseInventory (Items[index]))
					break;
			}
			if (player->health >= 50) return;
			// Using all of this item was not enough so delete it and restart with the next best one
			Items.Delete(index);
		}
	}
}